

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_9299::split_hostname
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *address)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  bool local_69;
  string host;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar2 = std::__cxx11::string::find((char)address,0x3a);
  lVar3 = std::__cxx11::string::rfind((char)address,0x3a);
  if (lVar2 == lVar3) {
    if (lVar3 == -1) {
LAB_001042d7:
      local_48._M_dataplus._M_p._0_1_ = 0;
      host._M_dataplus._M_p = (pointer)&host.field_2;
      host._M_string_length = 0;
      host.field_2._M_local_buf[0] = '\0';
      std::_Tuple_impl<0ul,std::__cxx11::string,bool,std::__cxx11::string>::
      _Tuple_impl<std::__cxx11::string_const&,bool,std::__cxx11::string,void>
                ((_Tuple_impl<0ul,std::__cxx11::string,bool,std::__cxx11::string> *)
                 __return_storage_ptr__,address,(bool *)&local_48,&host);
      goto LAB_00104305;
    }
  }
  else {
    pcVar1 = (address->_M_dataplus)._M_p;
    if (((*pcVar1 != '[') || (lVar3 == -1)) || (pcVar1[lVar3 + -1] != ']')) goto LAB_001042d7;
  }
  std::__cxx11::string::substr((ulong)&host,(ulong)address);
  local_69 = true;
  std::__cxx11::string::substr((ulong)&local_48,(ulong)address);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
            (__return_storage_ptr__,&host,&local_69,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
LAB_00104305:
  std::__cxx11::string::~string((string *)&host);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, bool, std::string> split_hostname(const std::string& address)
	{
		size_t first_of = address.find_first_of(':');
		size_t last_of = address.find_last_of(':');

		const bool multiple_semicolons = first_of != last_of;
		const bool can_be_ipv6 = !multiple_semicolons ? false :
			address[0] == '[' && address[last_of - 1] == ']';
		if (last_of == std::string::npos || (multiple_semicolons && !can_be_ipv6))
			return std::make_tuple(address, false, std::string());
		else
		{
			const size_t port_off = last_of + sizeof(':');
			std::string host = (multiple_semicolons && can_be_ipv6)
				? address.substr(1, last_of - 2)
				: address.substr(0, last_of);
			return std::make_tuple(std::move(host), true, address.substr(port_off));
		}
	}